

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void tplt_xfer(char *name,FILE *in,FILE *out,int *lineno)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  char line [1000];
  undefined8 local_420;
  char local_418 [1000];
  
  local_420 = lineno;
  pcVar4 = fgets(local_418,1000,(FILE *)in);
joined_r0x0010acf0:
  if ((pcVar4 == (char *)0x0) || ((local_418[0] == '%' && (local_418[1] == '%')))) {
    return;
  }
  *local_420 = *local_420 + 1;
  if (name != (char *)0x0) {
    lVar6 = 0;
    iVar7 = 0;
    cVar1 = local_418[0];
    do {
      iVar8 = (int)lVar6;
      iVar3 = iVar8;
      if (cVar1 == 'P') {
        iVar2 = strncmp(local_418 + iVar8,"Parse",5);
        if ((iVar2 == 0) &&
           ((iVar8 == 0 ||
            (ppuVar5 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar5 + (ulong)(byte)local_418[(long)iVar8 + -1] * 2 + 1) & 4) == 0)
            ))) {
          if (iVar8 - iVar7 != 0 && iVar7 <= iVar8) {
            fprintf((FILE *)out,"%.*s",(ulong)(uint)(iVar8 - iVar7),local_418 + iVar7);
          }
          fputs(name,(FILE *)out);
          iVar3 = iVar8 + 4;
          iVar7 = iVar8 + 5;
        }
      }
      else if (cVar1 == '\0') goto LAB_0010adbb;
      cVar1 = local_418[(long)iVar3 + 1];
      lVar6 = (long)iVar3 + 1;
    } while( true );
  }
  lVar6 = 0;
  goto LAB_0010adc2;
LAB_0010adbb:
  lVar6 = (long)iVar7;
LAB_0010adc2:
  fputs(local_418 + lVar6,(FILE *)out);
  pcVar4 = fgets(local_418,1000,(FILE *)in);
  goto joined_r0x0010acf0;
}

Assistant:

PRIVATE void tplt_xfer(char *name, FILE *in, FILE *out, int *lineno)
{
  int i, iStart;
  char line[LINESIZE];
  while( fgets(line,LINESIZE,in) && (line[0]!='%' || line[1]!='%') ){
    (*lineno)++;
    iStart = 0;
    if( name ){
      for(i=0; line[i]; i++){
        if( line[i]=='P' && strncmp(&line[i],"Parse",5)==0
          && (i==0 || !ISALPHA(line[i-1]))
        ){
          if( i>iStart ) fprintf(out,"%.*s",i-iStart,&line[iStart]);
          fprintf(out,"%s",name);
          i += 4;
          iStart = i+1;
        }
      }
    }
    fprintf(out,"%s",&line[iStart]);
  }
}